

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O0

string * __thiscall
flatbuffers::python::PythonGenerator::ReturnType_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,StructDef *struct_def,
          FieldDef *field)

{
  __type _Var1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_49;
  undefined1 local_48 [8];
  string self_type;
  FieldDef *field_local;
  StructDef *struct_def_local;
  PythonGenerator *this_local;
  string *field_type;
  
  self_type.field_2._8_8_ = field;
  std::__cxx11::string::string((string *)local_48,(string *)struct_def);
  local_49 = 0;
  TypeName_abi_cxx11_(__return_storage_ptr__,this,(FieldDef *)self_type.field_2._8_8_);
  _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_48,__return_storage_ptr__);
  if (_Var1) {
    std::operator+(&local_a0,"\'",__return_storage_ptr__);
    std::operator+(&local_80,&local_a0,"\'");
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  local_49 = 1;
  std::__cxx11::string::~string((string *)local_48);
  return __return_storage_ptr__;
}

Assistant:

std::string ReturnType(const StructDef &struct_def,
                         const FieldDef &field) const {
    // If we have a class member that returns an instance of the same class,
    // for example:
    // class Field(object):
    //   def Children(self, j: int) -> Optional[Field]:
    //     pass
    //
    // we need to quote the return type:
    // class Field(object):
    //   def Children(self, j: int) -> Optional['Field']:
    //     pass
    //
    // because Python is unable to resolve the name during parse and will return
    // an error.
    // (see PEP 484 under forward references:
    // https://peps.python.org/pep-0484/#forward-references)
    const std::string self_type = struct_def.name;
    std::string field_type = TypeName(field);

    if (self_type == field_type) { field_type = "'" + field_type + "'"; }

    return field_type;
  }